

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ENoSubScope.h
# Opt level: O0

void __thiscall ENoSubScope::ENoSubScope(ENoSubScope *this,string *arg)

{
  string *in_RSI;
  E *in_RDI;
  string *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  E::E(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  in_RDI->_vptr_E = (_func_int **)&PTR__ENoSubScope_00d32b18;
  return;
}

Assistant:

ENoSubScope(std::string arg):E(arg) {}